

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smatrix.h
# Opt level: O0

SMatrix<double,_3,_3> * __thiscall
gmath::SMatrix<double,_3,_3>::operator=(SMatrix<double,_3,_3> *this,SMatrix<double,_3,_3> *a)

{
  int i;
  int k;
  SMatrix<double,_3,_3> *a_local;
  SMatrix<double,_3,_3> *this_local;
  
  for (k = 0; k < 3; k = k + 1) {
    for (i = 0; i < 3; i = i + 1) {
      this->v[k][i] = a->v[k][i];
    }
  }
  return this;
}

Assistant:

SMatrix<T, nrows, ncols> &operator=(const SMatrix<T, nrows, ncols> &a)
    {
      for (int k=0; k<nrows; k++)
        for (int i=0; i<ncols; i++)
        {
          v[k][i]=a.v[k][i];
        }

      return *this;
    }